

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void * parse_bit_move(Parser *parser)

{
  BinaryExpr *left;
  void *right;
  Token *op;
  
  left = (BinaryExpr *)parse_add_sub(parser);
  op = parser->token;
  while (op->kind - LE2 < 2) {
    op = parser->token;
    move(parser);
    right = parse_add_sub(parser);
    left = new_binary_expr(left,op,right);
  }
  return left;
}

Assistant:

void *parse_bit_move(Parser *parser) {
    void *left = parse_add_sub(parser);
    Token *tok = token(parser);
    while (g_kind(tok) == LE2 || g_kind(tok) == BIG2) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_add_sub(parser));
    }
    return left;
}